

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerGLSL::check_explicit_lod_allowed(CompilerGLSL *this,uint32_t lod)

{
  float fVar1;
  Variant *pVVar2;
  ulong uVar3;
  SPIREntryPoint *pSVar4;
  SPIRConstant *pSVar5;
  runtime_error *this_00;
  byte bVar6;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  uVar3 = (ulong)lod;
  pSVar4 = Compiler::get_entry_point(&this->super_Compiler);
  bVar6 = pSVar4->model == ExecutionModelFragment |
          (this->options).es ^ 1U | 299 < (this->options).version;
  if ((lod != 0) && (bVar6 == 0)) {
    if ((uVar3 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size)
       && (pVVar2 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
          pVVar2[uVar3].type == TypeConstant)) {
      pSVar5 = Variant::get<spirv_cross::SPIRConstant>(pVVar2 + uVar3);
    }
    else {
      pSVar5 = (SPIRConstant *)0x0;
    }
    if (((pSVar5 == (SPIRConstant *)0x0) || (fVar1 = (pSVar5->m).c[0].r[0].f32, fVar1 != 0.0)) ||
       (NAN(fVar1))) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_40[0] = local_30;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_40,"Explicit lod not allowed in legacy ES non-fragment shaders.",""
                );
      ::std::runtime_error::runtime_error(this_00,(string *)local_40);
      *(undefined ***)this_00 = &PTR__runtime_error_0035b0b8;
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return (bool)bVar6;
}

Assistant:

bool CompilerGLSL::check_explicit_lod_allowed(uint32_t lod)
{
	auto &execution = get_entry_point();
	bool allowed = !is_legacy_es() || execution.model == ExecutionModelFragment;
	if (!allowed && lod != 0)
	{
		auto *lod_constant = maybe_get<SPIRConstant>(lod);
		if (!lod_constant || lod_constant->scalar_f32() != 0.0f)
		{
			SPIRV_CROSS_THROW("Explicit lod not allowed in legacy ES non-fragment shaders.");
		}
	}
	return allowed;
}